

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
CChainParams::GetAvailableSnapshotHeights
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CChainParams *this)

{
  long lVar1;
  pointer pAVar2;
  iterator __position;
  AssumeutxoData *data;
  pointer __args;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->m_assumeutxo_data).
                    super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_assumeutxo_data).
                    super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                    super__Vector_impl_data._M_start >> 4) * -0x3333333333333333);
  pAVar2 = (this->m_assumeutxo_data).
           super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (__args = (this->m_assumeutxo_data).
                super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>._M_impl.
                super__Vector_impl_data._M_start; __args != pAVar2; __args = __args + 1) {
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                 &__args->height);
    }
    else {
      *__position._M_current = __args->height;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<int> CChainParams::GetAvailableSnapshotHeights() const
{
    std::vector<int> heights;
    heights.reserve(m_assumeutxo_data.size());

    for (const auto& data : m_assumeutxo_data) {
        heights.emplace_back(data.height);
    }
    return heights;
}